

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wtmath.c
# Opt level: O3

void dwt_per_stride(double *inp,int N,double *lpd,double *hpd,int lpd_len,double *cA,int len_cA,
                   double *cD,int istride,int ostride)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long local_80;
  double *local_78;
  long local_70;
  ulong local_60;
  int local_44;
  int local_40;
  
  if (0 < len_cA) {
    uVar8 = lpd_len / 2;
    uVar2 = N - (N >> 0x1f) & 0xfffffffe;
    lVar14 = (long)(int)uVar8;
    lVar6 = (long)N;
    lVar4 = (long)istride;
    local_60 = lVar14 - lVar6;
    local_80 = -lVar14;
    local_44 = (N + uVar8 + 1) * istride;
    local_40 = (~N + uVar8) * istride;
    local_78 = inp + local_60 * lVar4;
    uVar13 = 0;
    local_70 = lVar14;
    do {
      lVar12 = uVar13 * (long)ostride;
      cA[lVar12] = 0.0;
      cD[lVar12] = 0.0;
      if (0 < lpd_len) {
        uVar5 = 0;
        pdVar11 = local_78;
        lVar15 = local_70;
        iVar7 = local_40;
        iVar3 = local_44;
        do {
          lVar9 = (uVar13 * 2 + lVar14) - uVar5;
          if (lVar15 < lVar6 && lVar14 <= lVar15) {
            pdVar10 = inp + lVar9 * lVar4;
LAB_0010fa41:
            cA[lVar12] = lpd[uVar5] * *pdVar10 + cA[lVar12];
            cD[lVar12] = hpd[uVar5] * *pdVar10 + cD[lVar12];
          }
          else {
            if ((uint)lVar15 < uVar8) {
              pdVar10 = inp + lVar9 * lVar4;
              goto LAB_0010fa41;
            }
            if (lVar15 < 0 && N == uVar2) {
              pdVar10 = inp + (lVar9 + lVar6) * lVar4;
              goto LAB_0010fa41;
            }
            if (N % 2 == 1 && lVar15 < 0) {
              pdVar10 = inp + (N + -1) * istride;
              iVar1 = iVar3;
              if (local_80 + uVar5 != 1) {
LAB_0010fa17:
                pdVar10 = inp + iVar1;
              }
              goto LAB_0010fa41;
            }
            pdVar10 = pdVar11;
            if (N == uVar2 && lVar6 <= lVar15) goto LAB_0010fa41;
            if (N % 2 == 1 && lVar6 <= lVar15) {
              pdVar10 = inp + (N + -1) * istride;
              iVar1 = iVar7;
              if (local_60 != uVar5) goto LAB_0010fa17;
              goto LAB_0010fa41;
            }
          }
          uVar5 = uVar5 + 1;
          iVar3 = iVar3 - istride;
          iVar7 = iVar7 - istride;
          lVar15 = lVar15 + -1;
          pdVar11 = pdVar11 + -lVar4;
        } while ((uint)lpd_len != uVar5);
      }
      uVar13 = uVar13 + 1;
      local_60 = local_60 + 2;
      local_80 = local_80 + -2;
      local_44 = local_44 + istride * 2;
      local_40 = local_40 + istride * 2;
      local_70 = local_70 + 2;
      local_78 = local_78 + lVar4 * 2;
    } while (uVar13 != (uint)len_cA);
  }
  return;
}

Assistant:

void dwt_per_stride(double *inp, int N, double *lpd,double*hpd,int lpd_len,double *cA, int len_cA, double *cD, int istride, int ostride) {
	int l, l2, isodd, i, t, len_avg,is,os;

	len_avg = lpd_len;
	l2 = len_avg / 2;
	isodd = N % 2;

	for (i = 0; i < len_cA; ++i) {
		t = 2 * i + l2;
		os = i *ostride;
		cA[os] = 0.0;
		cD[os] = 0.0;
		for (l = 0; l < len_avg; ++l) {
			if ((t - l) >= l2 && (t - l) < N) {
				is = (t - l) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) < l2 && (t - l) >= 0) {
				is = (t - l) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) < 0 && isodd == 0) {
				is = (t - l + N) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) < 0 && isodd == 1) {
				if ((t - l) != -1) {
					is = (t - l + N + 1) * istride;
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
				else {
					is = (N - 1) * istride;
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
			}
			else if ((t - l) >= N && isodd == 0) {
				is = (t - l - N) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) >= N && isodd == 1) {
				is = (t - l - (N + 1)) * istride;
				if (t - l != N) {
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
				else {
					is = (N - 1) * istride;
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
			}

		}
		
	}

}